

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QBackingStore * __thiscall QWidget::backingStore(QWidget *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QTLWExtra *this_01;
  QWidget *in_RDI;
  QTLWExtra *extra;
  QWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  QBackingStore *local_8;
  
  this_00 = d_func((QWidget *)0x35e49b);
  this_01 = QWidgetPrivate::maybeTopData(in_stack_ffffffffffffffe0);
  if ((this_01 == (QTLWExtra *)0x0) || (this_01->backingStore == (QBackingStore *)0x0)) {
    bVar1 = isWindow((QWidget *)this_01);
    if (bVar1) {
      local_8 = (QBackingStore *)0x0;
    }
    else {
      window(in_RDI);
      local_8 = backingStore((QWidget *)this_00);
    }
  }
  else {
    local_8 = this_01->backingStore;
  }
  return local_8;
}

Assistant:

QBackingStore *QWidget::backingStore() const
{
    Q_D(const QWidget);
    QTLWExtra *extra = d->maybeTopData();
    if (extra && extra->backingStore)
        return extra->backingStore;

    if (!isWindow())
        return window()->backingStore();

    return nullptr;
}